

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csat_apis.c
# Opt level: O2

CSAT_StatusT ABC_Solve(ABC_Manager mng)

{
  int iVar1;
  int iVar2;
  CSAT_StatusT CVar3;
  CSAT_Target_ResultT *pCVar4;
  char **ppcVar5;
  int *piVar6;
  Abc_Obj_t *pNode;
  char *pcVar7;
  long lVar8;
  ulong uVar9;
  Abc_Ntk_t *pNtk;
  
  if (mng->pTarget == (Abc_Ntk_t *)0x0) {
    puts("ABC_Solve: Target network is not derived by ABC_SolveInit().");
    CVar3 = UNDETERMINED;
  }
  else {
    if (mng->mode == 0) {
      iVar2 = Abc_NtkIvyProve(&mng->pTarget,&mng->Params);
    }
    else {
      iVar2 = Abc_NtkMiterSat(mng->pTarget,(long)(mng->Params).nMiteringLimitLast,0,0,
                              (ABC_INT64_T *)0x0,(ABC_INT64_T *)0x0);
    }
    pNtk = mng->pTarget;
    iVar1 = pNtk->vCis->nSize;
    uVar9 = (ulong)iVar1;
    pCVar4 = (CSAT_Target_ResultT *)calloc(1,0x38);
    pCVar4->no_sig = iVar1;
    ppcVar5 = (char **)calloc(1,uVar9 * 8);
    pCVar4->names = ppcVar5;
    piVar6 = (int *)calloc(1,uVar9 << 2);
    pCVar4->values = piVar6;
    mng->pResult = pCVar4;
    if (iVar2 != -1) {
      if (iVar2 == 0) {
        pCVar4->status = SATISFIABLE;
        for (lVar8 = 0; lVar8 < (int)uVar9; lVar8 = lVar8 + 1) {
          pNode = (Abc_Obj_t *)Vec_PtrEntry(mng->pNtk->vCis,(int)lVar8);
          pcVar7 = ABC_GetNodeName(mng,pNode);
          pcVar7 = Extra_UtilStrsav(pcVar7);
          mng->pResult->names[lVar8] = pcVar7;
          pNtk = mng->pTarget;
          pCVar4 = mng->pResult;
          pCVar4->values[lVar8] = pNtk->pModel[lVar8];
          uVar9 = (ulong)(uint)pCVar4->no_sig;
        }
        if (pNtk->pModel != (int *)0x0) {
          free(pNtk->pModel);
          pNtk = mng->pTarget;
          pNtk->pModel = (int *)0x0;
        }
      }
      else {
        if (iVar2 != 1) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/csat/csat_apis.c"
                        ,0x284,"enum CSAT_StatusT ABC_Solve(ABC_Manager)");
        }
        pCVar4->status = UNSATISFIABLE;
      }
    }
    Abc_NtkDelete(pNtk);
    mng->pTarget = (Abc_Ntk_t *)0x0;
    CVar3 = mng->pResult->status;
  }
  return CVar3;
}

Assistant:

enum CSAT_StatusT ABC_Solve( ABC_Manager mng )
{
    Prove_Params_t * pParams = &mng->Params;
    int RetValue, i;

    // check if the target network is available
    if ( mng->pTarget == NULL )
        { printf( "ABC_Solve: Target network is not derived by ABC_SolveInit().\n" ); return UNDETERMINED; }

    // try to prove the miter using a number of techniques
    if ( mng->mode )
        RetValue = Abc_NtkMiterSat( mng->pTarget, (ABC_INT64_T)pParams->nMiteringLimitLast, (ABC_INT64_T)0, 0, NULL, NULL );
    else
//        RetValue = Abc_NtkMiterProve( &mng->pTarget, pParams ); // old CEC engine
        RetValue = Abc_NtkIvyProve( &mng->pTarget, pParams ); // new CEC engine

    // analyze the result
    mng->pResult = ABC_TargetResAlloc( Abc_NtkCiNum(mng->pTarget) );
    if ( RetValue == -1 )
        mng->pResult->status = UNDETERMINED;
    else if ( RetValue == 1 )
        mng->pResult->status = UNSATISFIABLE;
    else if ( RetValue == 0 )
    {
        mng->pResult->status = SATISFIABLE;
        // create the array of PI names and values
        for ( i = 0; i < mng->pResult->no_sig; i++ )
        {
            mng->pResult->names[i]  = Extra_UtilStrsav( ABC_GetNodeName(mng, Abc_NtkCi(mng->pNtk, i)) ); 
            mng->pResult->values[i] = mng->pTarget->pModel[i];
        }
        ABC_FREE( mng->pTarget->pModel );
    }
    else assert( 0 );

    // delete the target
    Abc_NtkDelete( mng->pTarget );
    mng->pTarget = NULL;
    // return the status
    return mng->pResult->status;
}